

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

vector<Pathie::Path,_std::allocator<Pathie::Path>_> * __thiscall
Pathie::Path::children
          (vector<Pathie::Path,_std::allocator<Pathie::Path>_> *__return_storage_ptr__,Path *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  Path *__x;
  entry_iterator iter;
  allocator local_d2;
  allocator local_d1;
  vector<Pathie::Path,_std::allocator<Pathie::Path>_> *local_d0;
  entry_iterator local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  (__return_storage_ptr__->super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0 = __return_storage_ptr__;
  entry_iterator::entry_iterator(&local_c8,this);
  while( true ) {
    entry_iterator::entry_iterator((entry_iterator *)&local_b0);
    bVar1 = entry_iterator::operator!=(&local_c8,(entry_iterator *)&local_b0);
    entry_iterator::~entry_iterator((entry_iterator *)&local_b0);
    if (!bVar1) break;
    pbVar2 = &entry_iterator::operator*(&local_c8)->m_path;
    std::__cxx11::string::string((string *)&local_50,".",&local_d1);
    Path((Path *)&local_b0,&local_50);
    bVar1 = std::operator!=(pbVar2,&local_b0);
    if (bVar1) {
      pbVar2 = &entry_iterator::operator*(&local_c8)->m_path;
      std::__cxx11::string::string((string *)&local_90,"..",&local_d2);
      Path((Path *)&local_70,&local_90);
      bVar1 = std::operator!=(pbVar2,&local_70);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    if (bVar1 != false) {
      __x = entry_iterator::operator*(&local_c8);
      std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::push_back(local_d0,__x);
    }
    entry_iterator::operator++(&local_c8,0);
  }
  entry_iterator::~entry_iterator(&local_c8);
  return local_d0;
}

Assistant:

Path::Path()
{
  m_path = ".";
}